

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HatchetRegionProfileController.cpp
# Opt level: O2

string * __thiscall
(anonymous_namespace)::check_args_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,Options *opts)

{
  iterator iVar1;
  long lVar2;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  allocator<char> local_10d;
  allocator_type local_10c;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_10b;
  allocator<char> local_10a;
  allocator<char> local_109;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  string format;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  allowed_formats;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  string local_78 [32];
  string local_58 [32];
  string local_38 [32];
  
  cali::ConfigManager::Options::get_abi_cxx11_(&format,(Options *)this,"output.format","cali");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"cali",(allocator<char> *)&local_108);
  std::__cxx11::string::string<std::allocator<char>>(local_78,"json",&local_10d);
  std::__cxx11::string::string<std::allocator<char>>(local_58,"json-split",&local_109);
  std::__cxx11::string::string<std::allocator<char>>(local_38,"hatchet",&local_10a);
  __l._M_len = 4;
  __l._M_array = &local_98;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&allowed_formats,__l,&local_10b,&local_10c);
  lVar2 = 0x60;
  do {
    std::__cxx11::string::~string((string *)((long)&local_98._M_dataplus._M_p + lVar2));
    lVar2 = lVar2 + -0x20;
  } while (lVar2 != -0x20);
  iVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::find(&allowed_formats._M_t,&format);
  if ((_Rb_tree_header *)iVar1._M_node == &allowed_formats._M_t._M_impl.super__Rb_tree_header) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_108,"rocm-activity-profile: Invalid output format \"",&local_10d);
    std::operator+(&local_98,&local_108,&format);
    std::operator+(__return_storage_ptr__,&local_98,"\"");
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_108);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",(allocator<char> *)&local_98);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&allowed_formats._M_t);
  std::__cxx11::string::~string((string *)&format);
  return __return_storage_ptr__;
}

Assistant:

std::string check_args(const cali::ConfigManager::Options& opts)
{
    // Check if output.format is valid

    std::string           format          = opts.get("output.format", "json-split");
    std::set<std::string> allowed_formats = { "cali", "json", "json-split", "hatchet" };

    if (allowed_formats.find(format) == allowed_formats.end())
        return std::string("hatchet-region-profile: Invalid output format \"") + format + "\"";

    return "";
}